

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O2

int32_t uv__wtf8_decode1(char **input)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  pbVar2 = (byte *)*input;
  bVar1 = *pbVar2;
  if (-1 < (char)bVar1) {
    return (uint)bVar1;
  }
  uVar3 = 0xffffffff;
  if (0xc1 < bVar1) {
    *input = (char *)(pbVar2 + 1);
    if ((pbVar2[1] & 0xc0) == 0x80) {
      uVar4 = (uint)bVar1 << 6;
      uVar6 = pbVar2[1] & 0x3f;
      if (bVar1 < 0xe0) {
        return uVar6 | uVar4 & 0x7ff;
      }
      *input = (char *)(pbVar2 + 2);
      if ((pbVar2[2] & 0xffffffc0) == 0x80) {
        uVar5 = pbVar2[2] & 0x3f;
        if (bVar1 < 0xf0) {
          return uVar5 | (uVar6 | uVar4 & 0x3ff) << 6;
        }
        *input = (char *)(pbVar2 + 3);
        if ((bVar1 < 0xf5 && (pbVar2[3] & 0xffffffc0) == 0x80) &&
           (uVar4 = (uVar5 | (uVar6 | uVar4 & 0x1ff) << 6) << 6, uVar4 < 0x110000)) {
          uVar3 = pbVar2[3] & 0x3f | uVar4;
        }
      }
    }
  }
  return uVar3;
}

Assistant:

static int32_t uv__wtf8_decode1(const char** input) {
  uint32_t code_point;
  uint8_t b1;
  uint8_t b2;
  uint8_t b3;
  uint8_t b4;

  b1 = **input;
  if (b1 <= 0x7F)
    return b1; /* ASCII code point */
  if (b1 < 0xC2)
    return -1; /* invalid: continuation byte */
  code_point = b1;

  b2 = *++*input;
  if ((b2 & 0xC0) != 0x80)
    return -1; /* invalid: not a continuation byte */
  code_point = (code_point << 6) | (b2 & 0x3F);
  if (b1 <= 0xDF)
    return 0x7FF & code_point; /* two-byte character */

  b3 = *++*input;
  if ((b3 & 0xC0) != 0x80)
    return -1; /* invalid: not a continuation byte */
  code_point = (code_point << 6) | (b3 & 0x3F);
  if (b1 <= 0xEF)
    return 0xFFFF & code_point; /* three-byte character */

  b4 = *++*input;
  if ((b4 & 0xC0) != 0x80)
    return -1; /* invalid: not a continuation byte */
  code_point = (code_point << 6) | (b4 & 0x3F);
  if (b1 <= 0xF4) {
    code_point &= 0x1FFFFF;
    if (code_point <= 0x10FFFF)
      return code_point; /* four-byte character */
  }

  /* code point too large */
  return -1;
}